

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromLocale(CollationLoader *this,UErrorCode *errorCode)

{
  UBool UVar1;
  char *localeID;
  UResourceBundle *pUVar2;
  Locale *other;
  Locale local_1f8;
  undefined4 local_118;
  char *local_108;
  char *vLocale;
  Locale requestedLocale;
  UErrorCode *errorCode_local;
  CollationLoader *this_local;
  
  requestedLocale._216_8_ = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    localeID = Locale::getBaseName(&this->locale);
    pUVar2 = ures_openNoDefault_63("icudt63l-coll",localeID,(UErrorCode *)requestedLocale._216_8_);
    this->bundle = pUVar2;
    if (*(int *)requestedLocale._216_8_ == 2) {
      *(undefined4 *)requestedLocale._216_8_ = 0xffffff81;
      SharedObject::addRef(&this->rootEntry->super_SharedObject);
      this_local = (CollationLoader *)this->rootEntry;
    }
    else {
      Locale::Locale((Locale *)&vLocale,&this->locale);
      local_108 = ures_getLocaleByType_63
                            (this->bundle,ULOC_ACTUAL_LOCALE,(UErrorCode *)requestedLocale._216_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)requestedLocale._216_8_);
      if (UVar1 == '\0') {
        Locale::Locale(&local_1f8,local_108,(char *)0x0,(char *)0x0,(char *)0x0);
        other = Locale::operator=(&this->validLocale,&local_1f8);
        Locale::operator=(&this->locale,other);
        Locale::~Locale(&local_1f8);
        if (this->type[0] != '\0') {
          Locale::setKeywordValue
                    (&this->locale,"collation",this->type,(UErrorCode *)requestedLocale._216_8_);
        }
        UVar1 = Locale::operator!=(&this->locale,(Locale *)&vLocale);
        if (UVar1 == '\0') {
          this_local = (CollationLoader *)loadFromBundle(this,(UErrorCode *)requestedLocale._216_8_)
          ;
        }
        else {
          this_local = (CollationLoader *)getCacheEntry(this,(UErrorCode *)requestedLocale._216_8_);
        }
      }
      else {
        this_local = (CollationLoader *)0x0;
      }
      local_118 = 1;
      Locale::~Locale((Locale *)&vLocale);
    }
  }
  else {
    this_local = (CollationLoader *)0x0;
  }
  return (CollationCacheEntry *)this_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadFromLocale(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return NULL; }
    U_ASSERT(bundle == NULL);
    bundle = ures_openNoDefault(U_ICUDATA_COLL, locale.getBaseName(), &errorCode);
    if(errorCode == U_MISSING_RESOURCE_ERROR) {
        errorCode = U_USING_DEFAULT_WARNING;

        // Have to add that ref that we promise.
        rootEntry->addRef();
        return rootEntry;
    }
    Locale requestedLocale(locale);
    const char *vLocale = ures_getLocaleByType(bundle, ULOC_ACTUAL_LOCALE, &errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    locale = validLocale = Locale(vLocale);  // no type until loadFromCollations()
    if(type[0] != 0) {
        locale.setKeywordValue("collation", type, errorCode);
    }
    if(locale != requestedLocale) {
        return getCacheEntry(errorCode);
    } else {
        return loadFromBundle(errorCode);
    }
}